

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::addImportLoggingSupport(TranslateToFuzzReader *this)

{
  Name root;
  bool bVar1;
  reference pTVar2;
  pointer pFVar3;
  mapped_type *this_00;
  Expression *pEVar4;
  string_view sVar5;
  Type local_120;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> local_118;
  Signature local_110;
  HeapType local_100;
  Name local_f8;
  size_t local_e8;
  size_t sStack_e0;
  string_view local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  allocator<char> local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 auStack_48 [8];
  Name baseName;
  __single_object func;
  Type type;
  iterator __end1;
  iterator __begin1;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range1;
  TranslateToFuzzReader *this_local;
  
  __end1 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(&this->loggableTypes);
  type.id = (uintptr_t)
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end(&this->loggableTypes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                *)&type);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
             ::operator*(&__end1);
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         pTVar2->id;
    std::make_unique<wasm::Function>();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"log-",&local_89);
    wasm::Type::toString_abi_cxx11_();
    std::operator+(&local_68,&local_88,&local_c0);
    Name::Name((Name *)auStack_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    local_e8 = (size_t)auStack_48;
    sStack_e0 = baseName.super_IString.str._M_len;
    root.super_IString.str._M_str = (char *)baseName.super_IString.str._M_len;
    root.super_IString.str._M_len = (size_t)auStack_48;
    sVar5 = (string_view)Names::getValidFunctionName(this->wasm,root);
    local_d0 = sVar5;
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        &baseName.super_IString.str._M_str);
    Name::operator=((Name *)pFVar3,(Name *)&local_d0);
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        &baseName.super_IString.str._M_str);
    this_00 = std::
              unordered_map<wasm::Type,_wasm::Name,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>_>
              ::operator[](&this->logImportNames,(key_type *)&func);
    Name::operator=(this_00,(Name *)pFVar3);
    if ((this->preserveImportsAndExports & 1U) == 0) {
      Name::Name(&local_f8,"fuzzing-support");
      pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                          &baseName.super_IString.str._M_str);
      Name::operator=(&(pFVar3->super_Importable).module,&local_f8);
      pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                          &baseName.super_IString.str._M_str);
      Name::operator=(&(pFVar3->super_Importable).base,(Name *)auStack_48);
    }
    else {
      pEVar4 = (Expression *)Builder::makeNop(&this->builder);
      pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                          &baseName.super_IString.str._M_str);
      pFVar3->body = pEVar4;
    }
    local_118._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
         (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
         func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    Type::Type(&local_120,none);
    Signature::Signature
              (&local_110,
               (Type)local_118._M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,local_120);
    wasm::HeapType::HeapType(&local_100,local_110);
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        &baseName.super_IString.str._M_str);
    (pFVar3->type).id = local_100.id;
    wasm::Module::addFunction((unique_ptr *)this->wasm);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
               &baseName.super_IString.str._M_str);
    __gnu_cxx::
    __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void TranslateToFuzzReader::addImportLoggingSupport() {
  for (auto type : loggableTypes) {
    auto func = std::make_unique<Function>();
    Name baseName = std::string("log-") + type.toString();
    func->name = Names::getValidFunctionName(wasm, baseName);
    logImportNames[type] = func->name;
    if (!preserveImportsAndExports) {
      func->module = "fuzzing-support";
      func->base = baseName;
    } else {
      // We cannot add an import, so just make it a trivial function (this is
      // simpler than avoiding calls to logging in all the rest of the logic).
      func->body = builder.makeNop();
    }
    func->type = Signature(type, Type::none);
    wasm.addFunction(std::move(func));
  }
}